

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

int32_t __thiscall
icu_63::Calendar::computeZoneOffset(Calendar *this,double millis,double millisInDay,UErrorCode *ec)

{
  int iVar1;
  UDate tgmt_1;
  int local_68;
  int32_t offsetDelta;
  int32_t tmpDst;
  int32_t tmpRaw;
  UDate tgmt;
  TimeZone *pTStack_50;
  UBool sawRecentNegativeShift;
  TimeZone *tz;
  int nonExistingTimeOpt;
  int duplicatedTimeOpt;
  BasicTimeZone *btz;
  UDate wall;
  int32_t dstOffset;
  int32_t rawOffset;
  UErrorCode *ec_local;
  double millisInDay_local;
  double millis_local;
  Calendar *this_local;
  
  btz = (BasicTimeZone *)(millis + millisInDay);
  _dstOffset = ec;
  ec_local = (UErrorCode *)millisInDay;
  millisInDay_local = millis;
  millis_local = (double)this;
  _nonExistingTimeOpt = getBasicTimeZone(this);
  if (_nonExistingTimeOpt == (BasicTimeZone *)0x0) {
    pTStack_50 = getTimeZone(this);
    (*(pTStack_50->super_UObject)._vptr_UObject[6])
              (btz,pTStack_50,1,(long)&wall + 4,&wall,_dstOffset);
    tgmt._7_1_ = '\0';
    if (this->fRepeatedWallTime == UCAL_WALLTIME_FIRST) {
      _tmpDst = (double)btz - (double)(wall._4_4_ + wall._0_4_);
      (*(pTStack_50->super_UObject)._vptr_UObject[6])
                (_tmpDst - 21600000.0,pTStack_50,0,&offsetDelta,&local_68,_dstOffset);
      iVar1 = (wall._4_4_ + wall._0_4_) - (offsetDelta + local_68);
      if (iVar1 < 0) {
        tgmt._7_1_ = '\x01';
        (*(pTStack_50->super_UObject)._vptr_UObject[6])
                  ((double)btz + (double)iVar1,pTStack_50,1,(long)&wall + 4,&wall,_dstOffset);
      }
    }
    if ((tgmt._7_1_ == '\0') && (this->fSkippedWallTime == UCAL_WALLTIME_FIRST)) {
      (*(pTStack_50->super_UObject)._vptr_UObject[6])
                ((double)btz - (double)(wall._4_4_ + wall._0_4_),pTStack_50,0,(long)&wall + 4,&wall,
                 _dstOffset);
    }
  }
  else {
    tz._4_4_ = 0xc;
    if (this->fRepeatedWallTime == UCAL_WALLTIME_FIRST) {
      tz._4_4_ = 4;
    }
    tz._0_4_ = 4;
    if (this->fSkippedWallTime == UCAL_WALLTIME_FIRST) {
      tz._0_4_ = 0xc;
    }
    (*(_nonExistingTimeOpt->super_TimeZone).super_UObject._vptr_UObject[0x14])
              (btz,_nonExistingTimeOpt,(ulong)(uint)tz,(ulong)tz._4_4_,(long)&wall + 4,&wall,
               _dstOffset);
  }
  return wall._4_4_ + wall._0_4_;
}

Assistant:

int32_t Calendar::computeZoneOffset(double millis, double millisInDay, UErrorCode &ec) {
    int32_t rawOffset, dstOffset;
    UDate wall = millis + millisInDay;
    BasicTimeZone* btz = getBasicTimeZone();
    if (btz) {
        int duplicatedTimeOpt = (fRepeatedWallTime == UCAL_WALLTIME_FIRST) ? BasicTimeZone::kFormer : BasicTimeZone::kLatter;
        int nonExistingTimeOpt = (fSkippedWallTime == UCAL_WALLTIME_FIRST) ? BasicTimeZone::kLatter : BasicTimeZone::kFormer;
        btz->getOffsetFromLocal(wall, nonExistingTimeOpt, duplicatedTimeOpt, rawOffset, dstOffset, ec);
    } else {
        const TimeZone& tz = getTimeZone();
        // By default, TimeZone::getOffset behaves UCAL_WALLTIME_LAST for both.
        tz.getOffset(wall, TRUE, rawOffset, dstOffset, ec);

        UBool sawRecentNegativeShift = FALSE;
        if (fRepeatedWallTime == UCAL_WALLTIME_FIRST) {
            // Check if the given wall time falls into repeated time range
            UDate tgmt = wall - (rawOffset + dstOffset);

            // Any negative zone transition within last 6 hours?
            // Note: The maximum historic negative zone transition is -3 hours in the tz database.
            // 6 hour window would be sufficient for this purpose.
            int32_t tmpRaw, tmpDst;
            tz.getOffset(tgmt - 6*60*60*1000, FALSE, tmpRaw, tmpDst, ec);
            int32_t offsetDelta = (rawOffset + dstOffset) - (tmpRaw + tmpDst);

            U_ASSERT(offsetDelta < -6*60*60*1000);
            if (offsetDelta < 0) {
                sawRecentNegativeShift = TRUE;
                // Negative shift within last 6 hours. When UCAL_WALLTIME_FIRST is used and the given wall time falls
                // into the repeated time range, use offsets before the transition.
                // Note: If it does not fall into the repeated time range, offsets remain unchanged below.
                tz.getOffset(wall + offsetDelta, TRUE, rawOffset, dstOffset, ec);
            }
        }
        if (!sawRecentNegativeShift && fSkippedWallTime == UCAL_WALLTIME_FIRST) {
            // When skipped wall time option is WALLTIME_FIRST,
            // recalculate offsets from the resolved time (non-wall).
            // When the given wall time falls into skipped wall time,
            // the offsets will be based on the zone offsets AFTER
            // the transition (which means, earliest possibe interpretation).
            UDate tgmt = wall - (rawOffset + dstOffset);
            tz.getOffset(tgmt, FALSE, rawOffset, dstOffset, ec);
        }
    }
    return rawOffset + dstOffset;
}